

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O2

string * __thiscall
cmCTestSubmitHandler::ResponseParser::GetCurrentValue_abi_cxx11_
          (string *__return_storage_ptr__,ResponseParser *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (this->CurrentValue).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar1 != (this->CurrentValue).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__,(ulong)pcVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetCurrentValue()
  {
    std::string val;
    if (!this->CurrentValue.empty()) {
      val.assign(this->CurrentValue.data(), this->CurrentValue.size());
    }
    return val;
  }